

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ilimit_w;
  BYTE *iEnd;
  int *piVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  seqDef *psVar7;
  undefined8 uVar8;
  ulong uVar9;
  bool bVar10;
  int *piVar11;
  int iVar12;
  size_t sVar13;
  ulong uVar14;
  BYTE *pBVar15;
  uint uVar16;
  BYTE *pBVar17;
  U32 UVar18;
  int iVar19;
  long lVar20;
  char *pcVar21;
  int *piVar22;
  U32 UVar23;
  uint uVar24;
  int *iend;
  U32 maxDistance;
  uint uVar25;
  ulong uVar26;
  U32 UVar27;
  U32 UVar28;
  BYTE *litLimit_w;
  size_t ofbCandidate;
  int *local_b8;
  size_t local_68;
  BYTE *local_60;
  uint local_54;
  ulong local_50;
  BYTE *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  iEnd = (BYTE *)((long)src + srcSize);
  piVar1 = (int *)((long)src + (srcSize - 8));
  pBVar5 = (ms->window).base;
  pBVar6 = (ms->window).dictBase;
  uVar3 = (ms->window).dictLimit;
  local_60 = pBVar5 + uVar3;
  uVar25 = (ms->window).lowLimit;
  uVar16 = (ms->cParams).windowLog;
  uVar4 = (ms->cParams).minMatch;
  uVar24 = 6;
  if (uVar4 < 6) {
    uVar24 = uVar4;
  }
  local_54 = 4;
  if (4 < uVar24) {
    local_54 = uVar24;
  }
  UVar28 = *rep;
  UVar23 = rep[1];
  ms->lazySkipping = 0;
  piVar22 = (int *)((ulong)(local_60 == (BYTE *)src) + (long)src);
  local_b8 = (int *)src;
  local_38 = rep;
  if (piVar22 < piVar1) {
    local_48 = pBVar6 + uVar3;
    local_40 = pBVar6 + uVar25;
    uVar25 = 1 << ((byte)uVar16 & 0x1f);
    ilimit_w = (int *)(iEnd + -0x20);
    do {
      iVar12 = ((int)piVar22 - (int)pBVar5) + 1;
      UVar27 = (ms->window).lowLimit;
      UVar18 = iVar12 - uVar25;
      if (iVar12 - UVar27 <= uVar25) {
        UVar18 = UVar27;
      }
      if (ms->loadedDictEnd != 0) {
        UVar18 = UVar27;
      }
      uVar16 = iVar12 - UVar28;
      pBVar17 = pBVar5;
      if (uVar16 < uVar3) {
        pBVar17 = pBVar6;
      }
      iend = (int *)((long)piVar22 + 1);
      if ((uVar3 - 1) - uVar16 < 3) {
        iVar19 = 0;
        uVar26 = 0;
      }
      else {
        iVar19 = 0;
        uVar26 = 0;
        if (UVar28 <= iVar12 - UVar18) {
          if (*iend == *(int *)(pBVar17 + uVar16)) {
            pBVar15 = iEnd;
            if (uVar16 < uVar3) {
              pBVar15 = local_48;
            }
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)((long)piVar22 + 5),(BYTE *)((long)(pBVar17 + uVar16) + 4),
                                iEnd,pBVar15,local_60);
            uVar26 = sVar13 + 4;
            iVar19 = 6;
          }
          else {
            iVar19 = 0;
            uVar26 = 0;
          }
        }
      }
      UVar27 = UVar28;
      if (iVar19 == 6) {
        local_50 = 1;
LAB_00369bce:
        uVar14 = (long)iend - (long)local_b8;
        if (ilimit_w < iend) {
          ZSTD_safecopyLiterals(seqStore->lit,(BYTE *)local_b8,(BYTE *)iend,(BYTE *)ilimit_w);
        }
        else {
          pBVar17 = seqStore->lit;
          uVar8 = *(undefined8 *)(local_b8 + 2);
          *(undefined8 *)pBVar17 = *(undefined8 *)local_b8;
          *(undefined8 *)(pBVar17 + 8) = uVar8;
          if (0x10 < uVar14) {
            pBVar17 = seqStore->lit;
            uVar8 = *(undefined8 *)(local_b8 + 6);
            *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)(local_b8 + 4);
            *(undefined8 *)(pBVar17 + 0x18) = uVar8;
            if (0x20 < (long)uVar14) {
              lVar20 = 0;
              do {
                puVar2 = (undefined8 *)((long)local_b8 + lVar20 + 0x20);
                uVar8 = puVar2[1];
                pBVar15 = pBVar17 + lVar20 + 0x20;
                *(undefined8 *)pBVar15 = *puVar2;
                *(undefined8 *)(pBVar15 + 8) = uVar8;
                puVar2 = (undefined8 *)((long)local_b8 + lVar20 + 0x30);
                uVar8 = puVar2[1];
                *(undefined8 *)(pBVar15 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar15 + 0x18) = uVar8;
                lVar20 = lVar20 + 0x20;
              } while (pBVar15 + 0x20 < pBVar17 + uVar14);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar14;
        if (0xffff < uVar14) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar7 = seqStore->sequences;
        psVar7->litLength = (U16)uVar14;
        psVar7->offBase = (U32)local_50;
        if (0xffff < uVar26 - 3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar7->mlBase = (U16)(uVar26 - 3);
        seqStore->sequences = psVar7 + 1;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        piVar22 = (int *)((long)iend + uVar26);
        local_b8 = piVar22;
        do {
          UVar28 = UVar27;
          if (piVar1 < piVar22) break;
          iVar12 = (int)piVar22 - (int)pBVar5;
          UVar28 = (ms->window).lowLimit;
          UVar18 = iVar12 - uVar25;
          if (iVar12 - UVar28 <= uVar25) {
            UVar18 = UVar28;
          }
          if (ms->loadedDictEnd != 0) {
            UVar18 = UVar28;
          }
          uVar16 = iVar12 - UVar23;
          pBVar17 = pBVar5;
          if (uVar16 < uVar3) {
            pBVar17 = pBVar6;
          }
          bVar10 = false;
          uVar4 = UVar27;
          if ((2 < (uVar3 - 1) - uVar16) && (UVar23 <= iVar12 - UVar18)) {
            if (*piVar22 == *(int *)(pBVar17 + uVar16)) {
              pBVar15 = iEnd;
              if (uVar16 < uVar3) {
                pBVar15 = local_48;
              }
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)(piVar22 + 1),(BYTE *)((long)(pBVar17 + uVar16) + 4),iEnd,
                                  pBVar15,local_60);
              pBVar17 = seqStore->lit;
              if (ilimit_w < local_b8) {
                ZSTD_safecopyLiterals(pBVar17,(BYTE *)local_b8,(BYTE *)local_b8,(BYTE *)ilimit_w);
              }
              else {
                uVar8 = *(undefined8 *)(local_b8 + 2);
                *(undefined8 *)pBVar17 = *(undefined8 *)local_b8;
                *(undefined8 *)(pBVar17 + 8) = uVar8;
              }
              psVar7 = seqStore->sequences;
              psVar7->litLength = 0;
              psVar7->offBase = 1;
              if (0xffff < sVar13 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar7->mlBase = (U16)(sVar13 + 1);
              seqStore->sequences = psVar7 + 1;
              piVar22 = (int *)((long)piVar22 + sVar13 + 4);
              bVar10 = true;
              uVar4 = UVar23;
              UVar23 = UVar27;
              local_b8 = piVar22;
            }
            else {
              bVar10 = false;
            }
          }
          UVar27 = uVar4;
          UVar28 = UVar27;
        } while (bVar10);
      }
      else if (iVar19 == 0) {
        local_68 = 999999999;
        if (local_54 == 6) {
          uVar14 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar22,iEnd,&local_68);
        }
        else if (local_54 == 5) {
          uVar14 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)piVar22,iEnd,&local_68);
        }
        else {
          uVar14 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)piVar22,iEnd,&local_68);
        }
        uVar9 = local_68;
        piVar11 = piVar22;
        if (uVar14 <= uVar26) {
          uVar14 = uVar26;
          uVar9 = 1;
          piVar11 = iend;
        }
        iend = piVar11;
        uVar26 = uVar14;
        if (3 < uVar26) {
          local_50 = uVar9;
          if (3 < uVar9) {
            pcVar21 = (char *)((long)iend + (3 - (long)(pBVar5 + uVar9)));
            pBVar15 = local_60;
            pBVar17 = pBVar5;
            if ((uint)pcVar21 < uVar3) {
              pBVar15 = local_40;
              pBVar17 = pBVar6;
            }
            if ((local_b8 < iend) &&
               (uVar14 = (ulong)pcVar21 & 0xffffffff, pBVar15 < pBVar17 + uVar14)) {
              pBVar17 = pBVar17 + uVar14;
              do {
                piVar22 = (int *)((long)iend + -1);
                pBVar17 = pBVar17 + -1;
                if ((*(BYTE *)piVar22 != *pBVar17) ||
                   (uVar26 = uVar26 + 1, iend = piVar22, piVar22 <= local_b8)) break;
              } while (pBVar15 < pBVar17);
            }
            UVar27 = (int)uVar9 - 3;
            UVar23 = UVar28;
          }
          goto LAB_00369bce;
        }
        uVar26 = (long)piVar22 - (long)local_b8;
        piVar22 = (int *)((long)piVar22 + (uVar26 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar26);
      }
    } while (piVar22 < piVar1);
  }
  *local_38 = UVar28;
  local_38[1] = UVar23;
  return (long)iEnd - (long)local_b8;
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0);
}